

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_TreatRepeatedFieldAsMapWithIgnoredKeyFields_Test::
~MessageDifferencerTest_TreatRepeatedFieldAsMapWithIgnoredKeyFields_Test
          (MessageDifferencerTest_TreatRepeatedFieldAsMapWithIgnoredKeyFields_Test *this)

{
  MessageDifferencerTest_TreatRepeatedFieldAsMapWithIgnoredKeyFields_Test *this_local;
  
  ~MessageDifferencerTest_TreatRepeatedFieldAsMapWithIgnoredKeyFields_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, TreatRepeatedFieldAsMapWithIgnoredKeyFields) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  TextFormat::MergeFromString("rm { a: 11\n m { a: 12\n b: 13\n } }", &msg1);
  TextFormat::MergeFromString("rm { a: 11\n m { a: 12\n b: 14\n } }", &msg2);
  util::MessageDifferencer differ;
  differ.TreatAsMap(GetFieldDescriptor(msg1, "rm"),
                    GetFieldDescriptor(msg1, "rm.m"));
  differ.AddIgnoreCriteria(std::make_unique<TestIgnorer>());
  EXPECT_TRUE(differ.Compare(msg1, msg2));
}